

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O0

unsigned_long CalculateFrameShift(unsigned_long M,unsigned_long N)

{
  unsigned_long uVar1;
  ulong local_40;
  unsigned_long lcm;
  unsigned_long i;
  unsigned_long result;
  unsigned_long N_local;
  unsigned_long M_local;
  
  i = 0;
  if (M == 0) {
    __assert_fail("M > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/common/pa_process.c"
                  ,0x4f,"unsigned long CalculateFrameShift(unsigned long, unsigned long)");
  }
  if (N != 0) {
    uVar1 = LCM(M,N);
    for (lcm = M; lcm < uVar1; lcm = M + lcm) {
      if (lcm % N < i) {
        local_40 = i;
      }
      else {
        local_40 = lcm % N;
      }
      i = local_40;
    }
    return i;
  }
  __assert_fail("N > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/audacity[P]portaudio/src/common/pa_process.c"
                ,0x50,"unsigned long CalculateFrameShift(unsigned long, unsigned long)");
}

Assistant:

static unsigned long CalculateFrameShift( unsigned long M, unsigned long N )
{
    unsigned long result = 0;
    unsigned long i;
    unsigned long lcm;

    assert( M > 0 );
    assert( N > 0 );

    lcm = LCM( M, N );
    for( i = M; i < lcm; i += M )
        result = PA_MAX_( result, i % N );

    return result;
}